

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_background.h
# Opt level: O1

void __thiscall SAUF_BG<TTA>::PerformLabeling(SAUF_BG<TTA> *this)

{
  int iVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  long lVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint v;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long local_a0;
  Mat local_90 [96];
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_;
  uVar7 = *(uint *)&pMVar2->field_0x8;
  uVar10 = *(uint *)&pMVar2->field_0xc;
  cv::Mat::Mat(local_90,**(int **)&pMVar2->field_0x40,(*(int **)&pMVar2->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_;
  TTA::Alloc((int)((long)*(int *)&pMVar2->field_0xc + 1U >> 1) * (*(int *)&pMVar2->field_0x8 + 1) +
             1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  if (0 < (int)uVar7) {
    local_a0 = -1;
    uVar9 = 0;
    do {
      if (0 < (int)uVar10) {
        pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_;
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_;
        lVar4 = *(long *)&pMVar2->field_0x10;
        lVar13 = **(long **)&pMVar2->field_0x48;
        lVar11 = *(long *)&pMVar3->field_0x10;
        lVar15 = **(long **)&pMVar3->field_0x48;
        lVar8 = lVar11 + lVar15 * uVar9;
        lVar14 = lVar8 + -4;
        lVar11 = lVar11 + lVar15 * local_a0;
        lVar15 = lVar13 * local_a0 + lVar4;
        lVar4 = lVar4 + lVar13 * uVar9;
        lVar13 = lVar4 + -1;
        uVar12 = 0;
        do {
          if (*(char *)(lVar4 + uVar12) == '\0') {
            if ((uVar9 == 0) || (*(char *)(lVar15 + uVar12) != '\0')) {
              if ((uVar12 == 0) || (*(char *)(lVar13 + uVar12) != '\0')) {
LAB_00218947:
                TTA::rtable_[TTA::length_] = TTA::length_;
                TTA::next_[TTA::length_] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar6 = TTA::length_;
                TTA::length_ = TTA::length_ + 1;
              }
              else {
LAB_0021893e:
                uVar6 = *(uint *)(lVar14 + uVar12 * 4);
              }
            }
            else {
              if ((uVar12 == 0) || (*(char *)(lVar13 + uVar12) != '\0')) goto LAB_002188b9;
              uVar6 = *(uint *)(lVar11 + uVar12 * 4);
              v = *(uint *)(lVar14 + uVar12 * 4);
LAB_002189a6:
              uVar6 = TTA::Merge(uVar6,v);
            }
          }
          else if ((uVar9 == 0) || (*(char *)(lVar15 + uVar12) == '\0')) {
            if ((uVar9 == 0) ||
               (((long)(int)uVar10 + -1 <= (long)uVar12 || (*(char *)(lVar15 + 1 + uVar12) == '\0'))
               )) {
              if ((uVar12 == 0 || uVar9 == 0) || (*(char *)(lVar15 + -1 + uVar12) == '\0')) {
                if ((uVar12 == 0) || (*(char *)(lVar13 + uVar12) == '\0')) goto LAB_00218947;
                goto LAB_0021893e;
              }
              uVar6 = *(uint *)(lVar11 + -4 + uVar12 * 4);
            }
            else {
              if (uVar12 != 0) {
                if (*(char *)(lVar15 + -1 + uVar12) == '\0') {
                  if (*(char *)(lVar13 + uVar12) == '\0') goto LAB_002189d3;
                  uVar6 = *(uint *)(lVar14 + uVar12 * 4);
                }
                else {
                  uVar6 = *(uint *)(lVar11 + -4 + uVar12 * 4);
                }
                v = *(uint *)(lVar11 + 4 + uVar12 * 4);
                goto LAB_002189a6;
              }
LAB_002189d3:
              uVar6 = *(uint *)(lVar11 + 4 + uVar12 * 4);
            }
          }
          else {
LAB_002188b9:
            uVar6 = *(uint *)(lVar11 + uVar12 * 4);
          }
          *(uint *)(lVar8 + uVar12 * 4) = uVar6;
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
      uVar9 = uVar9 + 1;
      local_a0 = local_a0 + 1;
    } while (uVar9 != uVar7);
  }
  puVar5 = TTA::rtable_;
  uVar7 = 1;
  if (1 < TTA::length_) {
    uVar9 = 1;
    do {
      if (uVar9 == puVar5[uVar9]) {
        uVar7 = uVar7 + 1;
        uVar10 = uVar7;
      }
      else {
        uVar10 = puVar5[puVar5[uVar9]];
      }
      puVar5[uVar9] = uVar10;
      uVar9 = uVar9 + 1;
    } while (uVar9 < TTA::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_true>).n_labels_ = uVar7;
  puVar5 = TTA::rtable_;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_;
  if (0 < *(int *)&pMVar3->field_0x8) {
    lVar8 = *(long *)&pMVar3->field_0x10;
    lVar4 = **(long **)&pMVar3->field_0x48;
    lVar13 = 0;
    do {
      iVar1 = *(int *)&pMVar3->field_0xc;
      if ((long)iVar1 != 0) {
        lVar11 = 0;
        do {
          *(uint *)(lVar8 + lVar11) = puVar5[*(uint *)(lVar8 + lVar11)];
          lVar11 = lVar11 + 4;
        } while ((long)iVar1 * 4 != lVar11);
      }
      lVar13 = lVar13 + 1;
      lVar8 = lVar8 + lVar4;
    } while (lVar13 < *(int *)&pMVar3->field_0x8);
  }
  TTA::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Allocation + initialization of the output image

        LabelsSolver::Alloc((size_t)img_.rows * (((size_t)img_.cols + 1) / 2) + ((size_t)img_.cols + 1) / 2 + 1); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const* const img_row = img_.ptr<unsigned char>(r);
            unsigned char const* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
            unsigned* const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const  img_labels_row_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img_row_prev[c - 1] > 0
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_R c < w - 1 && r > 0 && img_row_prev[c + 1] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0
#define CONDITION_Q_BG r > 0 && img_row_prev[c] == 0
#define CONDITION_S_BG c > 0 && img_row[c - 1] == 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c], img_labels_row[c - 1]); // x <- p + s

#include "labeling_sauf_bg_tree.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned* img_row_start = img_labels_.ptr<unsigned>(r);
            unsigned* const img_row_end = img_row_start + img_labels_.cols;
            for (; img_row_start != img_row_end; ++img_row_start) {
                *img_row_start = LabelsSolver::GetLabel(*img_row_start);
            }
        }

        LabelsSolver::Dealloc(); // Memory deallocation of the labels solver

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
#undef CONDITION_Q_BG
#undef CONDITION_S_BG
    }